

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGforStageCreation.cpp
# Opt level: O1

void __thiscall
BGforStageCreation::Fill_FirstOHtsI
          (BGforStageCreation *this,PlanningUnitMADPDiscrete *pu,Index ts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI)

{
  pointer puVar1;
  iterator __position;
  int iVar2;
  undefined4 extraout_var;
  LIndex i;
  undefined4 extraout_var_00;
  ulong uVar3;
  Index fI;
  Index local_2c;
  
  puVar1 = (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  iVar2 = (*(pu->super_PlanningUnit)._vptr_PlanningUnit[6])(pu);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    uVar3 = 0;
    do {
      i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex(pu,(Index)uVar3,ts);
      local_2c = Globals::CastLIndexToIndex(i);
      __position._M_current =
           (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)firstOHtsI,__position,
                   &local_2c);
      }
      else {
        *__position._M_current = local_2c;
        (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar3 = (ulong)((Index)uVar3 + 1);
      iVar2 = (*(pu->super_PlanningUnit)._vptr_PlanningUnit[6])(pu);
    } while (uVar3 < CONCAT44(extraout_var_00,iVar2));
  }
  return;
}

Assistant:

void  BGforStageCreation::Fill_FirstOHtsI(
        const PlanningUnitMADPDiscrete* pu,
        Index ts, 
        vector<Index>& firstOHtsI
        )
{
    firstOHtsI.clear();
    //because the OHs are constructed breath-first, we know the OHs for agent i
    //for this time step are numbered:
    //firstOHtsGI[i]...firstOHtsGI[i]+nrOH[i]-1
    //
    //(read first-OH-for-time-step-ts its Global Index)
    //
    //i.e. ohGI = ohI + firstOHtsGI 

    for(Index agI=0; agI < pu->GetNrAgents(); agI++)
    {
        Index fI = CastLIndexToIndex(pu->GetFirstObservationHistoryIndex(agI, ts));
        firstOHtsI.push_back(fI); 
    }
}